

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  cmState *this;
  allocator local_51;
  string local_50;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  cmState::DefineProperty(this,&local_50,SOURCE_FILE,briefDocs,longDocs,chained != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                    const char* briefDocs,
                                    const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE, briefDocs,
                                 longDocs, chained != 0);
}